

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

uint ApplicativeHelper::getArity(TermList sort)

{
  bool bVar1;
  uint uVar2;
  uint64_t in_RDI;
  TermList local_20;
  
  uVar2 = 0;
  local_20._content = in_RDI;
  while( true ) {
    bVar1 = Kernel::TermList::isArrowSort(&local_20);
    if (!bVar1) break;
    local_20._content =
         *(uint64_t *)
          (local_20._content + 0x20 + (ulong)(*(uint *)(local_20._content + 0xc) & 0xfffffff) * 8);
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

unsigned ApplicativeHelper::getArity(TermList sort)
{
  unsigned arity = 0;
  while(sort.isArrowSort()){
    sort = *sort.term()->nthArgument(1);
    arity++; 
  }
  return arity;
}